

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnd.h
# Opt level: O1

int rnl(int x)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  uVar1 = mt_random();
  uVar1 = uVar1 % (uint)x;
  lVar6 = (long)u.uluck;
  lVar3 = (long)u.moreluck;
  if ((int)(lVar3 + lVar6) != 0) {
    uVar2 = mt_random();
    if (SUB168(ZEXT416(uVar2) % SEXT816(0x32 - (lVar3 + lVar6)),0) != 0) {
      iVar4 = (int)u.moreluck + (int)u.uluck;
      iVar5 = iVar4 / 3;
      if (iVar4 < -5) {
        iVar5 = iVar4;
      }
      uVar2 = uVar1 - iVar5;
      uVar1 = 0;
      if ((-1 < (int)uVar2) && (uVar1 = x - 1, (int)uVar2 < x)) {
        uVar1 = uVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

static inline int rnl(int x)
{
	int i;

	i = RND(x);

	if (Luck && rn2(50 - Luck)) {
	    i -= (x <= 15 && Luck >= -5 ? Luck/3 : Luck);
	    if (i < 0) i = 0;
	    else if (i >= x) i = x-1;
	}

	return i;
}